

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor.cpp
# Opt level: O3

void __thiscall
cppgenerate::Constructor::printImplementation
          (Constructor *this,Class *parent,ostream *stream,bool inHeader)

{
  pointer pcVar1;
  char cVar2;
  size_type sVar3;
  Class *pCVar4;
  ostream *poVar5;
  bool bVar6;
  pointer pPVar7;
  pointer pMVar8;
  pointer pPVar9;
  pointer pMVar10;
  bool bVar11;
  vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
  initializerVariables;
  MemberVariable memberVar;
  vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_> local_148;
  Constructor *local_130;
  string local_128;
  Class *local_108;
  string local_100;
  undefined1 local_e0 [40];
  _Alloc_hider local_b8;
  size_type local_b0;
  char local_a8 [88];
  string local_50;
  
  local_148.
  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
  _M_impl.super__Vector_impl_data._M_start = (MemberVariable *)0x0;
  local_148.
  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
  _M_impl.super__Vector_impl_data._M_finish = (MemberVariable *)0x0;
  local_148.
  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130 = this;
  Class::getName_abi_cxx11_(&local_50,parent);
  printConstructorSignature(local_130,stream,&local_50,!inHeader);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pMVar8 = (parent->m_memberVariables).
           super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar10 = (parent->m_memberVariables).
            super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_108 = parent;
  if (pMVar8 != pMVar10) {
    do {
      MemberVariable::MemberVariable((MemberVariable *)local_e0,pMVar8);
      Variable::initializer_abi_cxx11_(&local_128,(Variable *)local_e0);
      sVar3 = local_128._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if (sVar3 != 0) {
        std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::
        push_back(&local_148,(MemberVariable *)local_e0);
      }
      MemberVariable::~MemberVariable((MemberVariable *)local_e0);
      pMVar8 = pMVar8 + 1;
    } while (pMVar8 != pMVar10);
  }
  pCVar4 = local_108;
  if (local_148.
      super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_148.
      super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pPVar9 = (local_108->m_parents).
             super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar7 = (local_108->m_parents).
             super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar7 == pPVar9) goto LAB_001138ac;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream," : ",3);
  pPVar9 = (pCVar4->m_parents).
           super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar7 = (pCVar4->m_parents).
           super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_001138ac:
  bVar11 = pPVar9 != pPVar7;
  cVar2 = (char)stream;
  if (bVar11) {
    bVar6 = false;
    do {
      local_e0._0_8_ = local_e0 + 0x10;
      pcVar1 = (pPVar9->parentName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e0,pcVar1,pcVar1 + (pPVar9->parentName)._M_string_length);
      local_e0._32_4_ = pPVar9->inheritanceType;
      pcVar1 = (pPVar9->initializer)._M_dataplus._M_p;
      local_b8._M_p = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar1,pcVar1 + (pPVar9->initializer)._M_string_length);
      if (bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,(char *)local_e0._0_8_,local_e0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"( ",2);
      if (local_b0 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,local_b8._M_p,local_b0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream," )",2);
      if (local_b8._M_p != local_a8) {
        operator_delete(local_b8._M_p);
      }
      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
        operator_delete((void *)local_e0._0_8_);
      }
      pPVar9 = pPVar9 + 1;
      bVar6 = true;
    } while (pPVar9 != pPVar7);
  }
  pMVar8 = local_148.
           super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_148.
      super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_148.
      super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pMVar10 = local_148.
              super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      MemberVariable::MemberVariable((MemberVariable *)local_e0,pMVar10);
      if (bVar11) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
      }
      Variable::name_abi_cxx11_(&local_128,(Variable *)local_e0);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,local_128._M_dataplus._M_p,local_128._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"( ",2);
      Variable::initializer_abi_cxx11_(&local_100,(Variable *)local_e0);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_100._M_dataplus._M_p,local_100._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," )",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      MemberVariable::~MemberVariable((MemberVariable *)local_e0);
      pMVar10 = pMVar10 + 1;
      bVar11 = true;
    } while (pMVar10 != pMVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  poVar5 = operator<<(stream,&local_130->m_code);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::~vector
            (&local_148);
  return;
}

Assistant:

void Constructor::printImplementation( const cppgenerate::Class* parent, std::ostream& stream, bool inHeader ) const{
    bool comma = false;
    std::vector<cppgenerate::MemberVariable> initializerVariables;

    printConstructorSignature( stream, parent->getName(), !inHeader );

    for( cppgenerate::MemberVariable memberVar : parent->m_memberVariables ){
        if( memberVar.initializer().size() ){
            initializerVariables.push_back( memberVar );
        }
    }

    if( initializerVariables.size() || parent->m_parents.size() ) stream << " : ";

    for( cppgenerate::Class::Parent clparent : parent->m_parents ){
        if( comma ) stream << "," << std::endl;
        stream << clparent.parentName << "( ";
        if( clparent.initializer.size() ) stream << clparent.initializer;
        stream << " )";
        comma = true;
    }


    for( cppgenerate::MemberVariable memberVar : initializerVariables ){
        if( comma ) stream << ", ";
        stream << memberVar.name() << "( " << memberVar.initializer() << " )" << std::endl;
        comma = true;
    }

    stream << "{" << std::endl;

    stream << m_code << std::endl;
    stream << "}" << std::endl;
}